

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

Token * __thiscall Lexer::match_name(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Type TVar5;
  ostream *poVar6;
  lexer_exception *this_00;
  undefined8 uVar7;
  string res;
  stringstream buffer;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [8];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  do {
    do {
      local_1f8._M_dataplus._M_p._0_1_ = this->current_;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1f8,1);
      advance(this);
      cVar1 = this->current_;
    } while ((byte)(cVar1 + 0x9fU) < 0x1a);
  } while ((((byte)(cVar1 - 0x30U) < 10) || (cVar1 == '_')) || ((byte)(cVar1 + 0xbfU) < 0x1a));
  std::__cxx11::stringbuf::str();
  iVar2 = (int)local_1f8._M_string_length;
  iVar4 = std::__cxx11::string::compare((char *)&local_1f8);
  if (iVar4 == 0) {
    TVar5 = kRead;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_1f8);
    if (iVar4 == 0) {
      TVar5 = kWrite;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&local_1f8);
      if (iVar4 == 0) {
        TVar5 = kWhile;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_1f8);
        if (iVar4 == 0) {
          TVar5 = kIf;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_1f8);
          if (iVar4 == 0) {
            TVar5 = kElse;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&local_1f8);
            if (iVar4 == 0) {
              TVar5 = kInt;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)&local_1f8);
              if (iVar4 == 0) {
                TVar5 = kReal;
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)&local_1f8);
                if (iVar4 == 0) {
                  TVar5 = kVoid;
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)&local_1f8);
                  if (iVar4 == 0) {
                    TVar5 = kFunc;
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)&local_1f8);
                    if (iVar4 != 0) {
                      bVar3 = Recognition::is_id(&local_1f8);
                      if (!bVar3) {
                        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
                        std::__cxx11::stringbuf::str(local_1a0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                          operator_delete(local_1d8._M_dataplus._M_p);
                        }
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (local_1a8,anon_var_dwarf_48f05,0x18);
                        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                           (local_1a8,
                                            (char *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                                             (char)local_1f8._M_dataplus._M_p),
                                            CONCAT44(local_1f8._M_string_length._4_4_,
                                                     (int)local_1f8._M_string_length));
                        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
                        this_00 = (lexer_exception *)__cxa_allocate_exception(0x38);
                        std::__cxx11::stringbuf::str();
                        lexer_exception::lexer_exception(this_00,&this->position_,&local_1d8);
                        __cxa_throw(this_00,&lexer_exception::typeinfo,
                                    lexer_exception::~lexer_exception);
                      }
                      uVar7._0_4_ = (this->position_).super_Position.row_;
                      uVar7._4_4_ = (this->position_).super_Position.col_;
                      __return_storage_ptr__->type_ = kIdentity;
                      (__return_storage_ptr__->content_)._M_dataplus._M_p =
                           (pointer)&(__return_storage_ptr__->content_).field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&__return_storage_ptr__->content_,
                                 CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                          (char)local_1f8._M_dataplus._M_p),
                                 CONCAT44(local_1f8._M_string_length._4_4_,
                                          (int)local_1f8._M_string_length) +
                                 CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                          (char)local_1f8._M_dataplus._M_p));
                      goto LAB_001236df;
                    }
                    TVar5 = kReturn;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  uVar7._0_4_ = (this->position_).super_Position.row_;
  uVar7._4_4_ = (this->position_).super_Position.col_;
  __return_storage_ptr__->type_ = TVar5;
  (__return_storage_ptr__->content_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->content_).field_2;
  (__return_storage_ptr__->content_)._M_string_length = 0;
  (__return_storage_ptr__->content_).field_2._M_local_buf[0] = '\0';
LAB_001236df:
  (__return_storage_ptr__->position_).super_Position.row_ = (int)uVar7;
  (__return_storage_ptr__->position_).super_Position.col_ = (int)((ulong)uVar7 >> 0x20);
  (__return_storage_ptr__->position_).super_Position._vptr_Position =
       (_func_int **)&PTR_clear_001539d0;
  (__return_storage_ptr__->position_).length_ = iVar2;
  (__return_storage_ptr__->extra_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->extra_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->extra_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,(char)local_1f8._M_dataplus._M_p) !=
      &local_1f8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1f8._M_dataplus._M_p._1_7_,(char)local_1f8._M_dataplus._M_p));
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::match_name() {
    std::stringstream buffer;
    do {
        buffer << current_;
        consume(false);
    } while (Recognition::is_letter(current_) || Recognition::is_digit(current_));

    std::string res = buffer.str();
    int length = (int)res.length();
    if (res == "read") {
        return Token(Token::Type::kRead, TokenPosition(position_, length));
    } else if (res == "write") {
        return Token(Token::Type::kWrite, TokenPosition(position_, length));
    } else if (res == "while") {
        return Token(Token::Type::kWhile, TokenPosition(position_, length));
    } else if (res == "if") {
        return Token(Token::Type::kIf, TokenPosition(position_, length));
    } else if (res == "else") {
        return Token(Token::Type::kElse, TokenPosition(position_, length));
    } else if (res == "int") {
        return Token(Token::Type::kInt, TokenPosition(position_, length));
    } else if (res == "real") {
        return Token(Token::Type::kReal, TokenPosition(position_, length));
    } else if (res == "void") {
        return Token(Token::Type::kVoid, TokenPosition(position_, length));
    } else if (res == "func") {
        return Token(Token::Type::kFunc, TokenPosition(position_, length));
    } else if (res == "return") {
        return Token(Token::Type::kReturn, TokenPosition(position_, length));
    } else if (Recognition::is_id(res)) {
        return Token(Token::Type::kIdentity, res, TokenPosition(position_, length));
    } else {
        buffer.str("");
        buffer << "不正确的标识符: \"" << res << "\"";
        throw lexer_exception(position_, buffer.str());
    }
}